

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O3

string * __thiscall
remote::Handle::GetPidString_abi_cxx11_(string *__return_storage_ptr__,Handle *this)

{
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 2;
  std::ostream::operator<<((ostream *)local_188,this->pid);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

string Handle::GetPidString() {
    stringstream ss;
    ss << dec << pid;
    return ss.str();
}